

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_random(Curl_easy *data,uchar *entropy,size_t length)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  
  if (data == (Curl_easy *)0x0) {
    _Var1 = rand_enough();
    if (_Var1) goto LAB_0016b1b0;
  }
  else {
    CVar2 = ossl_seed(data);
    if (CVar2 == CURLE_OK) {
LAB_0016b1b0:
      iVar3 = curlx_uztosi(length);
      iVar3 = RAND_bytes(entropy,iVar3);
      return (uint)(iVar3 != 1) * 2;
    }
  }
  return CURLE_FAILED_INIT;
}

Assistant:

static CURLcode ossl_random(struct Curl_easy *data,
                            unsigned char *entropy, size_t length)
{
  int rc;
  if(data) {
    if(ossl_seed(data)) /* Initiate the seed if not already done */
      return CURLE_FAILED_INIT; /* could not seed for some reason */
  }
  else {
    if(!rand_enough())
      return CURLE_FAILED_INIT;
  }
  /* RAND_bytes() returns 1 on success, 0 otherwise.  */
  rc = RAND_bytes(entropy, (ossl_valsize_t)curlx_uztosi(length));
  return rc == 1 ? CURLE_OK : CURLE_FAILED_INIT;
}